

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

void __thiscall
pica::Grid<(pica::Dimension)1,_double>::Grid
          (Grid<(pica::Dimension)1,_double> *this,PositionType *origin,PositionType *step,
          IndexType *size)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  Array1d<double> *this_00;
  ValueType value;
  ValueType in_stack_ffffffffffffff80;
  Array1d<double> *in_stack_ffffffffffffff88;
  
  Array1d<double>::Array1d
            (in_stack_ffffffffffffff88,(IndexType_conflict1)(int)((ulong)in_RDI >> 0x20),
             in_stack_ffffffffffffff80);
  Array1d<double>::Array1d
            (in_stack_ffffffffffffff88,(IndexType_conflict1)(int)((ulong)in_RDI >> 0x20),
             in_stack_ffffffffffffff80);
  this_00 = (Array1d<double> *)(in_RDI + 0x30);
  Array1d<double>::Array1d
            (this_00,(IndexType_conflict1)(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff80);
  value = (ValueType)(in_RDI + 0x48);
  Array1d<double>::Array1d(this_00,(IndexType_conflict1)(int)((ulong)in_RDI >> 0x20),value);
  Array1d<double>::Array1d(this_00,(IndexType_conflict1)(int)((ulong)in_RDI >> 0x20),value);
  Array1d<double>::Array1d(this_00,(IndexType_conflict1)(int)((ulong)in_RDI >> 0x20),value);
  Array1d<double>::Array1d(this_00,(IndexType_conflict1)(int)((ulong)in_RDI >> 0x20),value);
  Array1d<double>::Array1d(this_00,(IndexType_conflict1)(int)((ulong)in_RDI >> 0x20),value);
  Array1d<double>::Array1d(this_00,(IndexType_conflict1)(int)((ulong)in_RDI >> 0x20),value);
  *(undefined8 *)(in_RDI + 0xd8) = *in_RSI;
  *(undefined8 *)(in_RDI + 0xe0) = *in_RDX;
  return;
}

Assistant:

Grid(const PositionType& origin, const PositionType& step, const IndexType& size) :
        exData(size),
        eyData(size),
        ezData(size),
        bxData(size),
        byData(size),
        bzData(size),
        jxData(size),
        jyData(size),
        jzData(size),
        origin(origin),
        step(step) {}